

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O3

void ImGui::TableGcCompactTransientBuffers(ImGuiTable *table)

{
  int iVar1;
  ImGuiTableColumnSortSpecs *ptr;
  char *ptr_00;
  ImGuiTableColumn *pIVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  ImGuiContext *pIVar6;
  long lVar7;
  int iVar9;
  undefined1 auVar8 [16];
  int iVar10;
  undefined1 auVar11 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  int iVar29;
  int iVar30;
  int iVar33;
  undefined1 auVar31 [16];
  int iVar34;
  undefined1 auVar32 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar37 [16];
  long lVar12;
  
  pIVar6 = GImGui;
  ImDrawListSplitter::ClearFreeMemory(&table->DrawSplitter);
  ptr = (table->SortSpecsMulti).Data;
  if (ptr != (ImGuiTableColumnSortSpecs *)0x0) {
    (table->SortSpecsMulti).Size = 0;
    (table->SortSpecsMulti).Capacity = 0;
    MemFree(ptr);
    (table->SortSpecsMulti).Data = (ImGuiTableColumnSortSpecs *)0x0;
  }
  (table->SortSpecs).Specs = (ImGuiTableColumnSortSpecs *)0x0;
  table->IsSortSpecsDirty = true;
  ptr_00 = (table->ColumnsNames).Buf.Data;
  if (ptr_00 != (char *)0x0) {
    (table->ColumnsNames).Buf.Size = 0;
    (table->ColumnsNames).Buf.Capacity = 0;
    MemFree(ptr_00);
    (table->ColumnsNames).Buf.Data = (char *)0x0;
  }
  table->MemoryCompacted = true;
  auVar5 = _DAT_00165e40;
  iVar1 = table->ColumnsCount;
  if (0 < (long)iVar1) {
    pIVar2 = (table->Columns).Data;
    lVar7 = (long)iVar1 + -1;
    auVar8._8_4_ = (int)lVar7;
    auVar8._0_8_ = lVar7;
    auVar8._12_4_ = (int)((ulong)lVar7 >> 0x20);
    lVar7 = 0;
    auVar8 = auVar8 ^ _DAT_00165e40;
    auVar11 = _DAT_0016f680;
    auVar13 = _DAT_0016f690;
    auVar14 = _DAT_00165e20;
    auVar15 = _DAT_00165e30;
    do {
      auVar16 = auVar15 ^ auVar5;
      iVar30 = auVar8._0_4_;
      iVar29 = -(uint)(iVar30 < auVar16._0_4_);
      iVar9 = auVar8._4_4_;
      auVar17._4_4_ = -(uint)(iVar9 < auVar16._4_4_);
      iVar34 = auVar8._8_4_;
      iVar33 = -(uint)(iVar34 < auVar16._8_4_);
      iVar10 = auVar8._12_4_;
      auVar17._12_4_ = -(uint)(iVar10 < auVar16._12_4_);
      auVar26._4_4_ = iVar29;
      auVar26._0_4_ = iVar29;
      auVar26._8_4_ = iVar33;
      auVar26._12_4_ = iVar33;
      auVar35 = pshuflw(in_XMM11,auVar26,0xe8);
      auVar19._4_4_ = -(uint)(auVar16._4_4_ == iVar9);
      auVar19._12_4_ = -(uint)(auVar16._12_4_ == iVar10);
      auVar19._0_4_ = auVar19._4_4_;
      auVar19._8_4_ = auVar19._12_4_;
      auVar37 = pshuflw(in_XMM12,auVar19,0xe8);
      auVar17._0_4_ = auVar17._4_4_;
      auVar17._8_4_ = auVar17._12_4_;
      auVar36 = pshuflw(auVar35,auVar17,0xe8);
      auVar16._8_4_ = 0xffffffff;
      auVar16._0_8_ = 0xffffffffffffffff;
      auVar16._12_4_ = 0xffffffff;
      auVar16 = (auVar36 | auVar37 & auVar35) ^ auVar16;
      auVar16 = packssdw(auVar16,auVar16);
      if ((auVar16 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        *(undefined2 *)((long)&pIVar2->NameOffset + lVar7) = 0xffff;
      }
      auVar17 = auVar19 & auVar26 | auVar17;
      auVar16 = packssdw(auVar17,auVar17);
      auVar36._8_4_ = 0xffffffff;
      auVar36._0_8_ = 0xffffffffffffffff;
      auVar36._12_4_ = 0xffffffff;
      auVar16 = packssdw(auVar16 ^ auVar36,auVar16 ^ auVar36);
      if ((auVar16._0_4_ >> 0x10 & 1) != 0) {
        *(undefined2 *)((long)&pIVar2[1].NameOffset + lVar7) = 0xffff;
      }
      auVar16 = auVar14 ^ auVar5;
      iVar29 = -(uint)(iVar30 < auVar16._0_4_);
      auVar31._4_4_ = -(uint)(iVar9 < auVar16._4_4_);
      iVar33 = -(uint)(iVar34 < auVar16._8_4_);
      auVar31._12_4_ = -(uint)(iVar10 < auVar16._12_4_);
      auVar18._4_4_ = iVar29;
      auVar18._0_4_ = iVar29;
      auVar18._8_4_ = iVar33;
      auVar18._12_4_ = iVar33;
      auVar25._4_4_ = -(uint)(auVar16._4_4_ == iVar9);
      auVar25._12_4_ = -(uint)(auVar16._12_4_ == iVar10);
      auVar25._0_4_ = auVar25._4_4_;
      auVar25._8_4_ = auVar25._12_4_;
      auVar31._0_4_ = auVar31._4_4_;
      auVar31._8_4_ = auVar31._12_4_;
      auVar16 = auVar25 & auVar18 | auVar31;
      auVar16 = packssdw(auVar16,auVar16);
      auVar3._8_4_ = 0xffffffff;
      auVar3._0_8_ = 0xffffffffffffffff;
      auVar3._12_4_ = 0xffffffff;
      auVar16 = packssdw(auVar16 ^ auVar3,auVar16 ^ auVar3);
      if ((auVar16 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        *(undefined2 *)((long)&pIVar2[2].NameOffset + lVar7) = 0xffff;
      }
      auVar19 = pshufhw(auVar18,auVar18,0x84);
      auVar26 = pshufhw(auVar25,auVar25,0x84);
      auVar17 = pshufhw(auVar19,auVar31,0x84);
      auVar20._8_4_ = 0xffffffff;
      auVar20._0_8_ = 0xffffffffffffffff;
      auVar20._12_4_ = 0xffffffff;
      auVar20 = (auVar17 | auVar26 & auVar19) ^ auVar20;
      auVar19 = packssdw(auVar20,auVar20);
      if ((auVar19 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        *(undefined2 *)((long)&pIVar2[3].NameOffset + lVar7) = 0xffff;
      }
      auVar19 = auVar13 ^ auVar5;
      iVar29 = -(uint)(iVar30 < auVar19._0_4_);
      auVar22._4_4_ = -(uint)(iVar9 < auVar19._4_4_);
      iVar33 = -(uint)(iVar34 < auVar19._8_4_);
      auVar22._12_4_ = -(uint)(iVar10 < auVar19._12_4_);
      auVar27._4_4_ = iVar29;
      auVar27._0_4_ = iVar29;
      auVar27._8_4_ = iVar33;
      auVar27._12_4_ = iVar33;
      auVar16 = pshuflw(auVar16,auVar27,0xe8);
      auVar21._4_4_ = -(uint)(auVar19._4_4_ == iVar9);
      auVar21._12_4_ = -(uint)(auVar19._12_4_ == iVar10);
      auVar21._0_4_ = auVar21._4_4_;
      auVar21._8_4_ = auVar21._12_4_;
      in_XMM12 = pshuflw(auVar37 & auVar35,auVar21,0xe8);
      in_XMM12 = in_XMM12 & auVar16;
      auVar22._0_4_ = auVar22._4_4_;
      auVar22._8_4_ = auVar22._12_4_;
      auVar16 = pshuflw(auVar16,auVar22,0xe8);
      auVar35._8_4_ = 0xffffffff;
      auVar35._0_8_ = 0xffffffffffffffff;
      auVar35._12_4_ = 0xffffffff;
      auVar35 = (auVar16 | in_XMM12) ^ auVar35;
      auVar16 = packssdw(auVar35,auVar35);
      if ((auVar16 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        *(undefined2 *)((long)&pIVar2[4].NameOffset + lVar7) = 0xffff;
      }
      auVar22 = auVar21 & auVar27 | auVar22;
      auVar16 = packssdw(auVar22,auVar22);
      auVar37._8_4_ = 0xffffffff;
      auVar37._0_8_ = 0xffffffffffffffff;
      auVar37._12_4_ = 0xffffffff;
      auVar16 = packssdw(auVar16 ^ auVar37,auVar16 ^ auVar37);
      if ((auVar16 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        *(undefined2 *)((long)&pIVar2[5].NameOffset + lVar7) = 0xffff;
      }
      auVar16 = auVar11 ^ auVar5;
      iVar30 = -(uint)(iVar30 < auVar16._0_4_);
      auVar32._4_4_ = -(uint)(iVar9 < auVar16._4_4_);
      iVar34 = -(uint)(iVar34 < auVar16._8_4_);
      auVar32._12_4_ = -(uint)(iVar10 < auVar16._12_4_);
      auVar23._4_4_ = iVar30;
      auVar23._0_4_ = iVar30;
      auVar23._8_4_ = iVar34;
      auVar23._12_4_ = iVar34;
      auVar28._4_4_ = -(uint)(auVar16._4_4_ == iVar9);
      auVar28._12_4_ = -(uint)(auVar16._12_4_ == iVar10);
      auVar28._0_4_ = auVar28._4_4_;
      auVar28._8_4_ = auVar28._12_4_;
      auVar32._0_4_ = auVar32._4_4_;
      auVar32._8_4_ = auVar32._12_4_;
      auVar16 = auVar28 & auVar23 | auVar32;
      auVar16 = packssdw(auVar16,auVar16);
      auVar4._8_4_ = 0xffffffff;
      auVar4._0_8_ = 0xffffffffffffffff;
      auVar4._12_4_ = 0xffffffff;
      in_XMM11 = packssdw(auVar16 ^ auVar4,auVar16 ^ auVar4);
      if ((in_XMM11 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        *(undefined2 *)((long)&pIVar2[6].NameOffset + lVar7) = 0xffff;
      }
      auVar16 = pshufhw(auVar23,auVar23,0x84);
      auVar17 = pshufhw(auVar28,auVar28,0x84);
      auVar19 = pshufhw(auVar16,auVar32,0x84);
      auVar24._8_4_ = 0xffffffff;
      auVar24._0_8_ = 0xffffffffffffffff;
      auVar24._12_4_ = 0xffffffff;
      auVar24 = (auVar19 | auVar17 & auVar16) ^ auVar24;
      auVar16 = packssdw(auVar24,auVar24);
      if ((auVar16 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        *(undefined2 *)((long)&pIVar2[7].NameOffset + lVar7) = 0xffff;
      }
      lVar12 = auVar15._8_8_;
      auVar15._0_8_ = auVar15._0_8_ + 8;
      auVar15._8_8_ = lVar12 + 8;
      lVar12 = auVar14._8_8_;
      auVar14._0_8_ = auVar14._0_8_ + 8;
      auVar14._8_8_ = lVar12 + 8;
      lVar12 = auVar13._8_8_;
      auVar13._0_8_ = auVar13._0_8_ + 8;
      auVar13._8_8_ = lVar12 + 8;
      lVar12 = auVar11._8_8_;
      auVar11._0_8_ = auVar11._0_8_ + 8;
      auVar11._8_8_ = lVar12 + 8;
      lVar7 = lVar7 + 0x340;
    } while ((ulong)(iVar1 + 7U >> 3) * 0x340 - lVar7 != 0);
  }
  (pIVar6->TablesLastTimeActive).Data
  [(int)((ulong)((long)table - (long)(pIVar6->Tables).Buf.Data) >> 3) * -0x69d0369d] = -1.0;
  return;
}

Assistant:

void ImGui::TableGcCompactTransientBuffers(ImGuiTable* table)
{
    //IMGUI_DEBUG_LOG("TableGcCompactTransientBuffers() id=0x%08X\n", table->ID);
    ImGuiContext& g = *GImGui;
    IM_ASSERT(table->MemoryCompacted == false);
    table->DrawSplitter.ClearFreeMemory();
    table->SortSpecsMulti.clear();
    table->SortSpecs.Specs = NULL;
    table->IsSortSpecsDirty = true;
    table->ColumnsNames.clear();
    table->MemoryCompacted = true;
    for (int n = 0; n < table->ColumnsCount; n++)
        table->Columns[n].NameOffset = -1;
    g.TablesLastTimeActive[g.Tables.GetIndex(table)] = -1.0f;
}